

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation_p.h
# Opt level: O0

QVariant * _q_interpolateVariant<QLineF>(QLineF *from,QLineF *to,qreal progress)

{
  long lVar1;
  QLineF l;
  QLineF *in_RDI;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  qreal in_stack_ffffffffffffff98;
  QLineF *in_stack_ffffffffffffffa0;
  QLineF *pQVar2;
  qreal qVar3;
  undefined8 uStack_20;
  undefined8 uStack_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  qVar3 = (qreal)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  pQVar2 = in_RDI;
  _q_interpolate<QLineF>(in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  l.pt1.yp = (qreal)in_RDI;
  l.pt1.xp = (qreal)uStack_10;
  l.pt2.xp = (qreal)pQVar2;
  l.pt2.yp = qVar3;
  QVariant::QVariant(uStack_20,l);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline QVariant _q_interpolateVariant(const T &from, const T &to, qreal progress)
{
    return _q_interpolate(from, to, progress);
}